

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O0

string * __thiscall helics::ActionMessage::packetize_abi_cxx11_(ActionMessage *this)

{
  string *in_RSI;
  ActionMessage *in_RDI;
  string *data;
  ActionMessage *this_00;
  
  this_00 = in_RDI;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  packetize(this_00,in_RSI);
  return (string *)in_RDI;
}

Assistant:

std::string ActionMessage::packetize() const
{
    std::string data;
    packetize(data);
    return data;
}